

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_CCtx_params params_00;
  ZSTD_compressionParameters cParams;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  void *zc;
  uint uVar4;
  size_t code;
  undefined4 in_stack_fffffffffffffe64;
  ZSTD_strategy in_stack_fffffffffffffe68;
  ZSTD_CCtx *local_120;
  size_t err_code_1;
  size_t dictID;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  void *pvStack_70;
  ZSTD_CCtx *local_68;
  size_t err_code;
  undefined8 local_58;
  undefined8 local_50;
  ZSTD_strategy local_48;
  ZSTD_CDict *local_40;
  ZSTD_CDict *cdict_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  err_code._0_4_ = (params->cParams).windowLog;
  err_code._4_4_ = (params->cParams).chainLog;
  local_58._0_4_ = (params->cParams).hashLog;
  local_58._4_4_ = (params->cParams).searchLog;
  local_50._0_4_ = (params->cParams).minMatch;
  local_50._4_4_ = (params->cParams).targetLength;
  uVar1 = (params->cParams).hashLog;
  uVar2 = (params->cParams).searchLog;
  uVar3 = (params->cParams).minMatch;
  cParams.hashLog = uVar3;
  cParams.chainLog = uVar2;
  cParams.windowLog = uVar1;
  local_48 = (params->cParams).strategy;
  cParams.searchLog = local_50._4_4_;
  cParams.minMatch = local_48;
  cParams.targetLength = in_stack_fffffffffffffe64;
  cParams.strategy = in_stack_fffffffffffffe68;
  local_40 = cdict;
  cdict_local._0_4_ = dtlm;
  cdict_local._4_4_ = dictContentType;
  _dtlm_local = dictSize;
  dictSize_local = (size_t)dict;
  dict_local = cctx;
  code = ZSTD_checkCParams(cParams);
  uVar4 = ZSTD_isError(code);
  zc = dict_local;
  if (uVar4 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3637,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (dictSize_local != 0 && local_40 != (ZSTD_CDict *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3638,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((local_40 == (ZSTD_CDict *)0x0) || (local_40->dictContentSize == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((local_40->dictContentSize * 6 <= pledgedSrcSize && (pledgedSrcSize != 0xffffffffffffffff))
        && (local_40->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad))
  {
    memcpy(&dictID,params,0x90);
    params_00.cParams.chainLog = (int)uStack_f0;
    params_00.format = (undefined4)dictID;
    params_00.cParams.windowLog = dictID._4_4_;
    params_00.cParams.hashLog = (int)((ulong)uStack_f0 >> 0x20);
    params_00.cParams.searchLog = (int)uStack_e8;
    params_00.cParams.minMatch = (int)((ulong)uStack_e8 >> 0x20);
    params_00.cParams.targetLength = (int)uStack_e0;
    params_00.cParams.strategy = (int)((ulong)uStack_e0 >> 0x20);
    params_00.fParams.contentSizeFlag = (int)local_d8;
    params_00.fParams.checksumFlag = (int)((ulong)local_d8 >> 0x20);
    params_00.fParams.noDictIDFlag = (undefined4)uStack_d0;
    params_00.compressionLevel = uStack_d0._4_4_;
    params_00._48_8_ = uStack_c8;
    params_00.targetCBlockSize = uStack_c0;
    params_00.srcSizeHint = (undefined4)local_b8;
    params_00.attachDictPref = local_b8._4_4_;
    params_00.literalCompressionMode = (undefined4)uStack_b0;
    params_00.nbWorkers = uStack_b0._4_4_;
    params_00.jobSize = uStack_a8;
    params_00.overlapLog = (undefined4)uStack_a0;
    params_00.rsyncable = uStack_a0._4_4_;
    params_00.ldmParams.enableLdm = (undefined4)uStack_98;
    params_00.ldmParams.hashLog = uStack_98._4_4_;
    params_00.ldmParams.bucketSizeLog = (undefined4)uStack_90;
    params_00.ldmParams.minMatchLength = uStack_90._4_4_;
    params_00.ldmParams.hashRateLog = (undefined4)local_88;
    params_00.ldmParams.windowLog = local_88._4_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_80;
    params_00.customMem.customFree = (ZSTD_freeFunction)uStack_78;
    params_00.customMem.opaque = pvStack_70;
    local_68 = (ZSTD_CCtx *)
               ZSTD_resetCCtx_internal
                         ((ZSTD_CCtx *)zc,params_00,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
    uVar4 = ERR_isError((size_t)local_68);
    if (uVar4 == 0) {
      if (local_40 == (ZSTD_CDict *)0x0) {
        local_120 = (ZSTD_CCtx *)
                    ZSTD_compress_insertDictionary
                              (*(ZSTD_compressedBlockState_t **)((long)dict_local + 0x2f8),
                               (ZSTD_matchState_t *)((long)dict_local + 0x308),
                               (ldmState_t *)((long)dict_local + 0x288),
                               (ZSTD_cwksp *)((long)dict_local + 0x138),
                               (ZSTD_CCtx_params *)((long)dict_local + 0xa0),(void *)dictSize_local,
                               _dtlm_local,cdict_local._4_4_,(ZSTD_dictTableLoadMethod_e)cdict_local
                               ,*(void **)((long)dict_local + 0x3e0));
      }
      else {
        local_120 = (ZSTD_CCtx *)
                    ZSTD_compress_insertDictionary
                              (*(ZSTD_compressedBlockState_t **)((long)dict_local + 0x2f8),
                               (ZSTD_matchState_t *)((long)dict_local + 0x308),
                               (ldmState_t *)((long)dict_local + 0x288),
                               (ZSTD_cwksp *)((long)dict_local + 0x138),
                               (ZSTD_CCtx_params *)((long)dict_local + 0xa0),local_40->dictContent,
                               local_40->dictContentSize,cdict_local._4_4_,
                               (ZSTD_dictTableLoadMethod_e)cdict_local,
                               *(void **)((long)dict_local + 0x3e0));
      }
      uVar4 = ERR_isError((size_t)local_120);
      if (uVar4 == 0) {
        if ((ZSTD_CCtx *)0xffffffff < local_120) {
          __assert_fail("dictID <= UINT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3650,
                        "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                       );
        }
        *(int *)((long)dict_local + 0x130) = (int)local_120;
        cctx_local = (ZSTD_CCtx *)0x0;
      }
      else {
        cctx_local = local_120;
      }
    }
    else {
      cctx_local = local_68;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_usingCDict
                           ((ZSTD_CCtx *)dict_local,local_40,params,pledgedSrcSize,zbuff);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, *params, pledgedSrcSize,
                                     ZSTDcrp_makeClean, zbuff) );
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID);
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}